

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogBuffers.cpp
# Opt level: O1

void __thiscall
aeron::LogBuffers::LogBuffers
          (LogBuffers *this,uint8_t *address,int64_t logLength,int32_t termLength)

{
  long lVar1;
  
  this->_vptr_LogBuffers = (_func_int **)&PTR__LogBuffers_00164aa0;
  (this->m_memoryMappedFiles).
  super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_memoryMappedFiles).
  super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  lVar1 = 0;
  do {
    *(undefined ***)((long)&this->m_buffers[0]._vptr_AtomicBuffer + lVar1) =
         &PTR__AtomicBuffer_001639b0;
    *(undefined8 *)((long)&this->m_buffers[0].m_buffer + lVar1) = 0;
    *(undefined4 *)((long)&this->m_buffers[0].m_length + lVar1) = 0;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x60);
  this->m_buffers[3].m_buffer = address + logLength + -0x1000;
  this->m_buffers[3].m_length = 0x1000;
  lVar1 = 0x28;
  do {
    *(uint8_t **)((long)this->m_buffers + lVar1 + -0x20) = address;
    *(int32_t *)((long)&((LogBuffers *)(this->m_buffers + -1))->_vptr_LogBuffers + lVar1) =
         termLength;
    address = address + termLength;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x70);
  return;
}

Assistant:

LogBuffers::LogBuffers(std::uint8_t *address, std::int64_t logLength, std::int32_t termLength)
{
    m_buffers[LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX]
        .wrap(address + (logLength - LogBufferDescriptor::LOG_META_DATA_LENGTH),
            LogBufferDescriptor::LOG_META_DATA_LENGTH);

    for (int i = 0; i < LogBufferDescriptor::PARTITION_COUNT; i++)
    {
        m_buffers[i].wrap(address + (i * termLength), termLength);
    }
}